

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O0

int llhttp__internal__c_mul_add_content_length
              (llhttp__internal_t *state,uchar *p,uchar *endp,int match)

{
  int match_local;
  uchar *endp_local;
  uchar *p_local;
  llhttp__internal_t *state_local;
  int local_4;
  
  if (state->content_length < 0x1000000000000000) {
    state->content_length = state->content_length << 4;
    if (match < 0) {
      if (state->content_length < (ulong)-(long)match) {
        return 1;
      }
    }
    else if (-(long)match - 1U < state->content_length) {
      return 1;
    }
    state->content_length = (long)match + state->content_length;
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int llhttp__internal__c_mul_add_content_length(
    llhttp__internal_t* state,
    const unsigned char* p,
    const unsigned char* endp,
    int match) {
  /* Multiplication overflow */
  if (state->content_length > 0xffffffffffffffffULL / 16) {
    return 1;
  }
  
  state->content_length *= 16;
  
  /* Addition overflow */
  if (match >= 0) {
    if (state->content_length > 0xffffffffffffffffULL - match) {
      return 1;
    }
  } else {
    if (state->content_length < 0ULL - match) {
      return 1;
    }
  }
  state->content_length += match;
  return 0;
}